

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O3

void __thiscall bloaty::ArgParser::ArgParser(ArgParser *this,int *argc,char ***argv)

{
  int iVar1;
  char *pcVar2;
  char **ppcVar3;
  allocator_type local_19;
  
  iVar1 = *argc;
  this->argc_ = iVar1;
  std::vector<char*,std::allocator<char*>>::vector<char**,void>
            ((vector<char*,std::allocator<char*>> *)&this->argv_,*argv,*argv + iVar1,&local_19);
  this->out_argc_ = argc;
  this->out_argv_ = argv;
  this->index_ = 0;
  *argc = 0;
  iVar1 = this->index_;
  this->index_ = iVar1 + 1;
  pcVar2 = (this->argv_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
           super__Vector_impl_data._M_start[iVar1];
  ppcVar3 = *argv;
  iVar1 = *argc;
  *argc = iVar1 + 1;
  ppcVar3[iVar1] = pcVar2;
  return;
}

Assistant:

ArgParser(int* argc, char** argv[])
      : argc_(*argc),
        argv_(*argv, *argv + *argc),
        out_argc_(argc),
        out_argv_(argv) {
    *out_argc_ = 0;
    ConsumeAndSaveArg();  // Executable name.
  }